

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampbuf.c
# Opt level: O2

sample_t_conflict ** create_sample_buffer(int n_channels,int32 length)

{
  sample_t_conflict **__ptr;
  sample_t_conflict *psVar1;
  long lVar2;
  
  __ptr = (sample_t_conflict **)malloc((long)n_channels * 8);
  if (__ptr != (sample_t_conflict **)0x0) {
    psVar1 = (sample_t_conflict *)malloc((long)(n_channels * length) << 2);
    *__ptr = psVar1;
    if (psVar1 != (sample_t_conflict *)0x0) {
      for (lVar2 = 1; lVar2 < n_channels; lVar2 = lVar2 + 1) {
        __ptr[lVar2] = __ptr[lVar2 + -1] + length;
      }
      return __ptr;
    }
    free(__ptr);
  }
  return (sample_t_conflict **)0x0;
}

Assistant:

sample_t **create_sample_buffer(int n_channels, int32 length)
{
	int i;
	sample_t **samples = malloc(n_channels * sizeof(*samples));
	if (!samples) return NULL;
	samples[0] = malloc(n_channels * length * sizeof(*samples[0]));
	if (!samples[0]) {
		free(samples);
		return NULL;
	}
	for (i = 1; i < n_channels; i++) samples[i] = samples[i-1] + length;
	return samples;
}